

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uart61.cpp
# Opt level: O1

void IMU_JY61::ParseData(char chr)

{
  undefined7 uVar1;
  ulong uVar2;
  tm *__tp;
  time_t *ptVar3;
  byte bVar4;
  long lVar5;
  char *pcVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  time_t local_20;
  time_t now;
  short sData [4];
  
  uVar2 = (ulong)ParseData::chrCnt;
  bVar4 = ParseData::chrCnt + 1;
  ParseData::chrCnt = bVar4;
  ParseData::chrBuf[uVar2] = chr;
  if (bVar4 < 0xb) {
    return;
  }
  if (((int)ParseData::chrBuf[0] != 0x55) || ((~ParseData::chrBuf[1] & 0x50U) != 0)) {
    printf("Error:%x %x\r\n",(ulong)(uint)(int)ParseData::chrBuf[0],
           (ulong)(uint)(int)ParseData::chrBuf[1]);
    ParseData::chrBuf[0] = ParseData::chrBuf[1];
    uVar1 = CONCAT61(ParseData::chrBuf._2_6_,ParseData::chrBuf[1]);
    ParseData::chrBuf[1] = (char)ParseData::chrBuf._2_6_;
    ParseData::chrBuf._2_6_ = (undefined6)(CONCAT17(ParseData::chrBuf[8],uVar1) >> 0x10);
    ParseData::chrBuf[8] = ParseData::chrBuf[9];
    ParseData::chrBuf[9] = ParseData::chrBuf[10];
    ParseData::chrCnt = ParseData::chrCnt + 0xff;
    return;
  }
  now = CONCAT17(ParseData::chrBuf[9],CONCAT16(ParseData::chrBuf[8],ParseData::chrBuf._2_6_));
  switch(ParseData::chrBuf[1]) {
  case 'Q':
    ptVar3 = &now;
    lVar5 = 0;
    do {
      *(float *)((long)&a + lVar5) = (float)(int)(short)*ptVar3 * 3.0517578e-05 * 16.0;
      ptVar3 = (time_t *)((long)ptVar3 + 2);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    time(&local_20);
    __tp = localtime(&local_20);
    pcVar6 = asctime(__tp);
    printf("\r\nT:%s a:%6.3f %6.3f %6.3f ",(double)a,(double)DAT_001061f8,(double)DAT_001061fc,
           pcVar6);
    ParseData::chrCnt = '\0';
    return;
  case 'R':
    ptVar3 = &now;
    lVar5 = 0;
    do {
      *(float *)((long)&w + lVar5) = (float)(int)(short)*ptVar3 * 3.0517578e-05 * 2000.0;
      ptVar3 = (time_t *)((long)ptVar3 + 2);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    dVar7 = (double)w;
    dVar8 = (double)DAT_00106204;
    dVar9 = (double)DAT_00106208;
    pcVar6 = "w: %7.3f %7.3f %7.3f\n";
    break;
  case 'S':
    ptVar3 = &now;
    lVar5 = 0;
    do {
      *(float *)((long)&Angle + lVar5) = (float)(int)(short)*ptVar3 * 3.0517578e-05 * 180.0;
      ptVar3 = (time_t *)((long)ptVar3 + 2);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    dVar7 = (double)Angle;
    dVar8 = (double)DAT_00106210;
    dVar9 = (double)DAT_00106214;
    pcVar6 = "A:%7.3f %7.3f %7.3f\n";
    break;
  case 'T':
    ptVar3 = &now;
    lVar5 = 0;
    do {
      *(float *)((long)&h + lVar5) = (float)(int)(short)*ptVar3;
      ptVar3 = (time_t *)((long)ptVar3 + 2);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    dVar7 = (double)h;
    dVar8 = (double)DAT_0010621c;
    dVar9 = (double)DAT_00106220;
    pcVar6 = "h:%4.0f %4.0f %4.0f\n";
    break;
  default:
    goto switchD_00102c2f_default;
  }
  printf(pcVar6,dVar7,dVar8,dVar9);
switchD_00102c2f_default:
  ParseData::chrCnt = '\0';
  return;
}

Assistant:

void ParseData(char chr)
    {
        static char chrBuf[100];
        static unsigned char chrCnt=0;
        signed short sData[4];
        unsigned char i;

        time_t now;
        chrBuf[chrCnt++]=chr;
        if (chrCnt<11) return;

        if ((chrBuf[0]!=0x55)||((chrBuf[1]&0x50)!=0x50)) {printf("Error:%x %x\r\n",chrBuf[0],chrBuf[1]);memcpy(&chrBuf[0],&chrBuf[1],10);chrCnt--;return;}

        memcpy(&sData[0],&chrBuf[2],8);

        switch(chrBuf[1])
        {
            case 0x51:
                for (i=0;i<3;i++) a[i] = (float)sData[i]/32768.0*16.0;
                time(&now);
                printf("\r\nT:%s a:%6.3f %6.3f %6.3f ",asctime(localtime(&now)),a[0],a[1],a[2]);
                break;
            case 0x52:
                for (i=0;i<3;i++)
                    w[i] = (float)sData[i]/32768.0*2000.0;
                printf("w: %7.3f %7.3f %7.3f\n",w[0],w[1],w[2]);
                break;
            case 0x53:
            {
                for (i=0;i<3;i++)
                    Angle[i] = (float)sData[i]/32768.0*180.0;
                printf("A:%7.3f %7.3f %7.3f\n",Angle[0],Angle[1],Angle[2]);
            }
                break;
            case 0x54:
                for (i=0;i<3;i++) h[i] = (float)sData[i];
                printf("h:%4.0f %4.0f %4.0f\n",h[0],h[1],h[2]);
                break;
        }
        chrCnt=0;
    }